

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall
tinyusdz::crate::CrateReader::ReadArray<tinyusdz::Payload>
          (CrateReader *this,vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *d)

{
  bool bVar1;
  ostream *poVar2;
  undefined1 local_958 [8];
  Payload p;
  size_t i;
  ostringstream local_810 [8];
  ostringstream ss_e_4;
  string local_698;
  ostringstream local_678 [8];
  ostringstream ss_e_3;
  string local_500;
  ostringstream local_4e0 [8];
  ostringstream ss_e_2;
  string local_368;
  ostringstream local_348 [8];
  ostringstream ss_e_1;
  uint local_1cc;
  undefined1 local_1c8 [4];
  uint32_t _n;
  ostringstream local_1a8 [8];
  ostringstream ss_e;
  uint32_t local_2c;
  double dStack_28;
  uint32_t shapesize;
  uint64_t n;
  vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *d_local;
  CrateReader *this_local;
  
  if (d == (vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_0024d2c1;
  }
  dStack_28 = 0.0;
  n = (uint64_t)d;
  d_local = (vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)this;
  if ((this->_version[0] == '\0') && (this->_version[1] < 7)) {
    bVar1 = StreamReader::read4(this->_sr,&local_2c);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadArray");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x60d);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_1a8,"Failed to read the number of array elements."
                                );
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)local_1c8);
      ::std::__cxx11::string::~string((string *)local_1c8);
      ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
      this_local._7_1_ = 0;
      goto LAB_0024d2c1;
    }
    bVar1 = StreamReader::read4(this->_sr,&local_1cc);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_348);
      poVar2 = ::std::operator<<((ostream *)local_348,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,"[Crate]");
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadArray");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x612);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_348,"Failed to read the number of array elements."
                                );
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_368);
      ::std::__cxx11::string::~string((string *)&local_368);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_348);
      goto LAB_0024d2c1;
    }
    dStack_28 = (double)(ulong)local_1cc;
  }
  else {
    bVar1 = StreamReader::read8(this->_sr,(uint64_t *)&stack0xffffffffffffffd8);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_4e0);
      poVar2 = ::std::operator<<((ostream *)local_4e0,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,"[Crate]");
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadArray");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x617);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_4e0,"Failed to read the number of array elements."
                                );
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_500);
      ::std::__cxx11::string::~string((string *)&local_500);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_4e0);
      goto LAB_0024d2c1;
    }
  }
  if ((this->_config).maxArrayElements < (ulong)dStack_28) {
    ::std::__cxx11::ostringstream::ostringstream(local_678);
    poVar2 = ::std::operator<<((ostream *)local_678,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,"[Crate]");
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReadArray");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x61d);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_678,"Too many array elements.");
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_698);
    ::std::__cxx11::string::~string((string *)&local_698);
    this_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_678);
  }
  else {
    this->_memoryUsage = (long)dStack_28 * 0x120 + this->_memoryUsage;
    if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
      ::std::__cxx11::ostringstream::ostringstream(local_810);
      poVar2 = ::std::operator<<((ostream *)local_810,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,"[Crate]");
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadArray");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x620);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_810,"Reached to max memory budget.");
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)&i);
      ::std::__cxx11::string::~string((string *)&i);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_810);
    }
    else {
      for (p.layerOffset._scale = 0.0; (ulong)p.layerOffset._scale < (ulong)dStack_28;
          p.layerOffset._scale = (double)((long)p.layerOffset._scale + 1)) {
        Payload::Payload((Payload *)local_958);
        bVar1 = ReadPayload(this,(Payload *)local_958);
        if (bVar1) {
          ::std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>::
          emplace_back<tinyusdz::Payload&>
                    ((vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>> *)n,
                     (Payload *)local_958);
        }
        else {
          this_local._7_1_ = 0;
        }
        Payload::~Payload((Payload *)local_958);
        if (!bVar1) goto LAB_0024d2c1;
      }
      this_local._7_1_ = 1;
    }
  }
LAB_0024d2c1:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CrateReader::ReadArray(std::vector<Payload> *d) {

  if (!d) {
    return false;
  }

  uint64_t n{0};
  if (VERSION_LESS_THAN_0_8_0(_version)) {
    uint32_t shapesize; // not used
    if (!_sr->read4(&shapesize)) {
      PUSH_ERROR("Failed to read the number of array elements.");
      return false;
    }
    uint32_t _n;
    if (!_sr->read4(&_n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
    }
    n = _n;
  } else {
    if (!_sr->read8(&n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
      return false;
    }
  }

  if (n > _config.maxArrayElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many array elements.");
  }

  CHECK_MEMORY_USAGE(sizeof(Payload) * n);

  for (size_t i = 0; i < n; i++) {
    Payload p;
    if (!ReadPayload(&p)) {
      return false;
    }
    d->emplace_back(p);
  }

  return true;
}